

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_0::CastFinder::CastFinder(CastFinder *this,PassOptions *options)

{
  PassOptions *options_local;
  CastFinder *this_local;
  
  PostWalker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
  ::PostWalker(&this->
                super_PostWalker<wasm::(anonymous_namespace)::CastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::CastFinder,_void>_>
              );
  SmallUnorderedSet<wasm::HeapType,_5UL>::SmallUnorderedSet(&this->castTypes);
  this->trapsNeverHappen = (bool)(options->trapsNeverHappen & 1);
  return;
}

Assistant:

CastFinder(const PassOptions& options)
    : trapsNeverHappen(options.trapsNeverHappen) {}